

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O3

bool CSOAA::test_ldf_sequence(ldf *data,size_t start_K,multi_ex *ec_seq)

{
  vw_ostream *pvVar1;
  example *ec;
  vw *pvVar2;
  char cVar3;
  byte bVar4;
  byte bVar5;
  bool bVar6;
  pointer ppeVar7;
  ostream *poVar8;
  vw_exception *this;
  ulong uVar9;
  stringstream __msg;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8;
  
  ppeVar7 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar9 = (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)ppeVar7 >> 3;
  bVar4 = 1;
  if (uVar9 != start_K) {
    bVar4 = (*(code *)PTR_test_label_002d1a50)(&ppeVar7[start_K]->l);
    ppeVar7 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar9 = (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)ppeVar7 >> 3;
  }
  if (start_K < uVar9) {
    do {
      ec = ppeVar7[start_K];
      bVar5 = (*(code *)PTR_test_label_002d1a50)(&ec->l);
      if (bVar5 != (bVar4 & 1)) {
        pvVar2 = data->all;
        pvVar1 = &pvVar2->trace_message;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&pvVar1->super_ostream,
                   "warning: ldf example has mix of train/test data; assuming test",0x3e);
        cVar3 = (char)pvVar1;
        std::ios::widen((char)(pvVar2->trace_message).super_ostream._vptr_basic_ostream[-3] + cVar3)
        ;
        std::ostream::put(cVar3);
        std::ostream::flush();
        bVar4 = 1;
      }
      bVar6 = COST_SENSITIVE::ec_is_example_header(ec);
      if (bVar6) {
        std::__cxx11::stringstream::stringstream(local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&local_1a8,"warning: example headers at position ",0x25);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,": can only have in initial position!",0x24);
        this = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (this,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/csoaa.cc"
                   ,0x11d,&local_1d8);
        __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      start_K = start_K + 1;
      ppeVar7 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (start_K < (ulong)((long)(ec_seq->
                                     super__Vector_base<example_*,_std::allocator<example_*>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar7 >> 3)
            );
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool test_ldf_sequence(ldf& data, size_t start_K, multi_ex& ec_seq)
{
  bool isTest;
  if (start_K == ec_seq.size())
    isTest = true;
  else
    isTest = COST_SENSITIVE::cs_label.test_label(&ec_seq[start_K]->l);
  for (size_t k = start_K; k < ec_seq.size(); k++)
  {
    example* ec = ec_seq[k];
    // Each sub-example must have just one cost
    assert(ec->l.cs.costs.size() == 1);

    if (COST_SENSITIVE::cs_label.test_label(&ec->l) != isTest)
    {
      isTest = true;
      data.all->trace_message << "warning: ldf example has mix of train/test data; assuming test" << endl;
    }
    if (ec_is_example_header(*ec))
      THROW("warning: example headers at position " << k << ": can only have in initial position!");
  }
  return isTest;
}